

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGetProcAddressTests.cpp
# Opt level: O3

int __thiscall deqp::egl::GetProcAddressTests::init(GetProcAddressTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *eglTestCtx;
  long *name;
  GetProcAddressExtensionCase *node;
  char cVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  GetProcAddressCase *pGVar3;
  ulong uVar4;
  long lVar5;
  string testName;
  long *local_a0 [2];
  long local_90 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  GetProcAddressExtensionCase *local_60;
  TestNode *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"extension",
             "Test EGL extensions");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  lVar5 = 0;
  local_58 = pTVar2;
  do {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,(&(anonymous_namespace)::s_extensions)[lVar5 * 3],
               (allocator<char> *)local_a0);
    local_a0[0] = local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_a0,local_80._M_dataplus._M_p,
               local_80._M_dataplus._M_p + local_80._M_string_length);
    if (local_80._M_string_length != 0) {
      uVar4 = 0;
      do {
        cVar1 = de::toLower(local_80._M_dataplus._M_p[uVar4]);
        *(char *)((long)local_a0[0] + uVar4) = cVar1;
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_80._M_string_length);
    }
    local_60 = (GetProcAddressExtensionCase *)operator_new(0xd0);
    name = local_a0[0];
    eglTestCtx = (this->super_TestCaseGroup).m_eglTestCtx;
    std::operator+(&local_50,"Test ",&local_80);
    node = local_60;
    GetProcAddressExtensionCase::GetProcAddressExtensionCase
              (local_60,eglTestCtx,(char *)name,local_50._M_dataplus._M_p,&local_80);
    tcu::TestNode::addChild(local_58,(TestNode *)node);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_a0[0] != local_90) {
      operator_delete(local_a0[0],local_90[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x9d);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"core",
             "Test core functions");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pGVar3 = (GetProcAddressCase *)operator_new(0xb8);
  GetProcAddressCase::GetProcAddressCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"egl","Test EGL core functions");
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressCase_003ed258;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  pGVar3 = (GetProcAddressCase *)operator_new(0xb8);
  GetProcAddressCase::GetProcAddressCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"gles","Test OpenGL ES core functions")
  ;
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressCase_003ed258;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  pGVar3 = (GetProcAddressCase *)operator_new(0xb8);
  GetProcAddressCase::GetProcAddressCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"gles2",
             "Test OpenGL ES 2 core functions");
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressCase_003ed258;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 4;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  pGVar3 = (GetProcAddressCase *)operator_new(0xb8);
  GetProcAddressCase::GetProcAddressCase
            (pGVar3,(this->super_TestCaseGroup).m_eglTestCtx,"gles3",
             "Test OpenGL ES 3 core functions");
  (pGVar3->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GetProcAddressCase_003ed258;
  *(undefined4 *)&pGVar3[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x40;
  tcu::TestNode::addChild(pTVar2,(TestNode *)pGVar3);
  return extraout_EAX;
}

Assistant:

void GetProcAddressTests::init (void)
{
	// extensions
	{
		tcu::TestCaseGroup* extensionsGroup = new tcu::TestCaseGroup(m_testCtx, "extension", "Test EGL extensions");
		addChild(extensionsGroup);

		for (int extNdx = 0; extNdx < DE_LENGTH_OF_ARRAY(s_extensions); extNdx++)
		{
			const std::string&		extName		= s_extensions[extNdx].name;
			std::string				testName	(extName);

			for (size_t ndx = 0; ndx < extName.length(); ndx++)
				testName[ndx] = de::toLower(extName[ndx]);

			extensionsGroup->addChild(new GetProcAddressExtensionCase(m_eglTestCtx, testName.c_str(), ("Test " + extName).c_str(), extName));
		}
	}

	// core functions
	{
		tcu::TestCaseGroup* coreFuncGroup = new tcu::TestCaseGroup(m_testCtx, "core", "Test core functions");
		addChild(coreFuncGroup);

		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"egl",		"Test EGL core functions",			0));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles",		"Test OpenGL ES core functions",	EGL_OPENGL_ES_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles2",	"Test OpenGL ES 2 core functions",	EGL_OPENGL_ES2_BIT));
		coreFuncGroup->addChild(new GetProcAddressCoreFunctionsCase	(m_eglTestCtx,	"gles3",	"Test OpenGL ES 3 core functions",	EGL_OPENGL_ES3_BIT_KHR));
	}
}